

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall
level_tools::push_subdivisions_v5
          (level_tools *this,level_mesh *mesh,uint16_t sector_idx,uint32_t ogf_idx)

{
  uint16_t texture;
  xr_ogf *this_00;
  bool bVar1;
  uint uVar2;
  uint32_t eshader_idx;
  int iVar3;
  int iVar4;
  const_reference ppxVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  reference puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  xr_ogf_v3 *ogf;
  uint32_t ogf_idx_local;
  uint16_t sector_idx_local;
  level_mesh *mesh_local;
  level_tools *this_local;
  
  ppxVar5 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                      (this->m_subdivisions,(ulong)ogf_idx);
  this_00 = *ppxVar5;
  uVar2 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])();
  if ((uVar2 & 1) == 0) {
    eshader_idx = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                    [0x1e])();
    bVar1 = is_compiled_wallmark(this,eshader_idx);
    if (!bVar1) {
      iVar3 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        ();
      iVar4 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        ();
      uVar2 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1d])
                        ();
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->m_uniq_textures,(ulong)uVar2);
      texture = *pvVar8;
      uVar2 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1e])
                        ();
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->m_uniq_shaders,(ulong)uVar2);
      level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var,iVar3),
                       (xr_ibuf *)CONCAT44(extraout_var_00,iVar4),texture,*pvVar8);
    }
  }
  else {
    pvVar6 = xray_re::xr_ogf::children_l(this_00);
    end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
    pvVar6 = xray_re::xr_ogf::children_l(this_00);
    local_38._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
    while (bVar1 = __gnu_cxx::operator!=(&end,&local_38), bVar1) {
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&end);
      push_subdivisions_v5(this,mesh,sector_idx,*puVar7);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&end);
    }
  }
  return;
}

Assistant:

void level_tools::push_subdivisions_v5(level_mesh* mesh, uint16_t sector_idx, uint32_t ogf_idx)
{
	xr_ogf_v3* ogf = static_cast<xr_ogf_v3*>(m_subdivisions->at(ogf_idx));
	if (ogf->hierarchical()) {
		for (std::vector<uint32_t>::const_iterator it = ogf->children_l().begin(),
				end = ogf->children_l().end(); it != end; ++it) {
			push_subdivisions_v5(mesh, sector_idx, *it);
		}
	} else if (is_compiled_wallmark(ogf->shader_l())) {
		;
	} else {
		mesh->push(sector_idx, ogf->vb(), ogf->ib(),
				m_uniq_textures[ogf->texture_l()],
				m_uniq_shaders[ogf->shader_l()]);
	}
}